

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O1

string * __thiscall
czh::utils::dtoa_abi_cxx11_(string *__return_storage_ptr__,utils *this,double *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  dVar2 = *(double *)this;
  if ((long)dVar2 < 0 && dVar2 == 0.0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"-0.0","");
  }
  else {
    paVar1 = &local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_58._M_dataplus._M_p = (pointer)paVar1;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      fill_double_abi_cxx11_(&local_38,this,ABS(dVar2));
      dtoa_abi_cxx11_();
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&local_58,0,0,"0.0",3);
    }
    if (0.0 < *(double *)this || *(double *)this == 0.0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_58.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_58._M_string_length;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      std::operator+(__return_storage_ptr__,"-",&local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dtoa(const double &value)
  {
    if (value == 0 && ((double_to_uint64(value) & SIGN_MASK) != 0))
    {
      return "-0.0";
    }
    std::string buffer;
    if (value == 0)
    {
      buffer = "0.0";
    }
    else
    {
      buffer = fill_double(std::abs(value));
    }
    if (value < 0)
    {
      return "-" + buffer;
    }
    return std::move(buffer);
  }